

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

int platform_ssh_share(char *pi_name,Conf *conf,Plug *downplug,Plug *upplug,Socket **sock,
                      char **logtext,char **ds_err,char **us_err,_Bool can_upstream,
                      _Bool can_downstream)

{
  int __fd;
  int iVar1;
  char *dirname_00;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  SockAddr *pSVar5;
  Socket *pSVar6;
  char *pcVar7;
  Socket *retsock;
  int lockfd;
  char *err;
  char *sockname;
  char *lockname;
  char *dirname;
  _Bool can_downstream_local;
  _Bool can_upstream_local;
  char **logtext_local;
  Socket **sock_local;
  Plug *upplug_local;
  Plug *downplug_local;
  Conf *conf_local;
  char *pi_name_local;
  
  dirname_00 = make_dirname(pi_name,logtext);
  if (dirname_00 != (char *)0x0) {
    pcVar2 = make_dir_and_check_ours(dirname_00);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = dupcat_fn(dirname_00,"/lock",0);
      __fd = open(pcVar2,0x242,0x180);
      if (__fd < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        pcVar4 = dupprintf("%s: open: %s",pcVar2,pcVar4);
        *logtext = pcVar4;
        safefree(dirname_00);
        safefree(pcVar2);
      }
      else {
        iVar1 = flock(__fd,2);
        if (iVar1 < 0) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          pcVar4 = dupprintf("%s: flock(LOCK_EX): %s",pcVar2,pcVar4);
          *logtext = pcVar4;
          safefree(dirname_00);
          safefree(pcVar2);
          close(__fd);
        }
        else {
          pcVar4 = dupprintf("%s/socket",dirname_00);
          *logtext = (char *)0x0;
          if (can_downstream) {
            pSVar5 = unix_sock_addr(pcVar4);
            pSVar6 = new_connection(pSVar5,anon_var_dwarf_23ee3 + 10,0,false,true,false,false,
                                    downplug,conf,(Interactor *)0x0);
            pcVar7 = sk_socket_error(pSVar6);
            if (pcVar7 == (char *)0x0) {
              safefree(*logtext);
              *logtext = pcVar4;
              *sock = pSVar6;
              safefree(dirname_00);
              safefree(pcVar2);
              close(__fd);
              return 1;
            }
            safefree(*ds_err);
            pcVar7 = sk_socket_error(pSVar6);
            pcVar7 = dupprintf("%s: %s",pcVar4,pcVar7);
            *ds_err = pcVar7;
            sk_close(pSVar6);
          }
          if (can_upstream) {
            pSVar5 = unix_sock_addr(pcVar4);
            pSVar6 = new_unix_listener(pSVar5,upplug);
            pcVar7 = sk_socket_error(pSVar6);
            if (pcVar7 == (char *)0x0) {
              safefree(*logtext);
              *logtext = pcVar4;
              *sock = pSVar6;
              safefree(dirname_00);
              safefree(pcVar2);
              close(__fd);
              return 2;
            }
            safefree(*us_err);
            pcVar7 = sk_socket_error(pSVar6);
            pcVar7 = dupprintf("%s: %s",pcVar4,pcVar7);
            *us_err = pcVar7;
            sk_close(pSVar6);
          }
          if (((*logtext == (char *)0x0) && (*ds_err == (char *)0x0)) && (*us_err == (char *)0x0)) {
            __assert_fail("*logtext || *ds_err || *us_err",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                          ,0x14c,
                          "int platform_ssh_share(const char *, Conf *, Plug *, Plug *, Socket **, char **, char **, char **, _Bool, _Bool)"
                         );
          }
          safefree(dirname_00);
          safefree(pcVar2);
          safefree(pcVar4);
          close(__fd);
        }
      }
    }
    else {
      *logtext = pcVar2;
      safefree(dirname_00);
    }
  }
  return 0;
}

Assistant:

int platform_ssh_share(const char *pi_name, Conf *conf,
                       Plug *downplug, Plug *upplug, Socket **sock,
                       char **logtext, char **ds_err, char **us_err,
                       bool can_upstream, bool can_downstream)
{
    char *dirname, *lockname, *sockname, *err;
    int lockfd;
    Socket *retsock;

    /*
     * Sort out what we're going to call the directory in which we
     * keep the socket. This has the side effect of potentially
     * creating its top-level containing dir and/or the salt file
     * within that, if they don't already exist.
     */
    dirname = make_dirname(pi_name, logtext);
    if (!dirname) {
        return SHARE_NONE;
    }

    /*
     * Now make sure the subdirectory exists.
     */
    if ((err = make_dir_and_check_ours(dirname)) != NULL) {
        *logtext = err;
        sfree(dirname);
        return SHARE_NONE;
    }

    /*
     * Acquire a lock on a file in that directory.
     */
    lockname = dupcat(dirname, "/lock");
    lockfd = open(lockname, O_CREAT | O_RDWR | O_TRUNC, 0600);
    if (lockfd < 0) {
        *logtext = dupprintf("%s: open: %s", lockname, strerror(errno));
        sfree(dirname);
        sfree(lockname);
        return SHARE_NONE;
    }
    if (flock(lockfd, LOCK_EX) < 0) {
        *logtext = dupprintf("%s: flock(LOCK_EX): %s",
                             lockname, strerror(errno));
        sfree(dirname);
        sfree(lockname);
        close(lockfd);
        return SHARE_NONE;
    }

    sockname = dupprintf("%s/socket", dirname);

    *logtext = NULL;

    if (can_downstream) {
        retsock = new_connection(unix_sock_addr(sockname),
                                 "", 0, false, true, false, false,
                                 downplug, conf, NULL);
        if (sk_socket_error(retsock) == NULL) {
            sfree(*logtext);
            *logtext = sockname;
            *sock = retsock;
            sfree(dirname);
            sfree(lockname);
            close(lockfd);
            return SHARE_DOWNSTREAM;
        }
        sfree(*ds_err);
        *ds_err = dupprintf("%s: %s", sockname, sk_socket_error(retsock));
        sk_close(retsock);
    }

    if (can_upstream) {
        retsock = new_unix_listener(unix_sock_addr(sockname), upplug);
        if (sk_socket_error(retsock) == NULL) {
            sfree(*logtext);
            *logtext = sockname;
            *sock = retsock;
            sfree(dirname);
            sfree(lockname);
            close(lockfd);
            return SHARE_UPSTREAM;
        }
        sfree(*us_err);
        *us_err = dupprintf("%s: %s", sockname, sk_socket_error(retsock));
        sk_close(retsock);
    }

    /* One of the above clauses ought to have happened. */
    assert(*logtext || *ds_err || *us_err);

    sfree(dirname);
    sfree(lockname);
    sfree(sockname);
    close(lockfd);
    return SHARE_NONE;
}